

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

ON_3dPointListRef *
ON_3dPointListRef::FromPointArray
          (ON_3dPointListRef *__return_storage_ptr__,ON_SimpleArray<ON_3dPoint> *point_array)

{
  uint uVar1;
  ON_3dPoint *point_array_00;
  ON_3dPointListRef *p;
  ON_SimpleArray<ON_3dPoint> *point_array_local;
  
  ON_3dPointListRef(__return_storage_ptr__);
  uVar1 = ON_SimpleArray<ON_3dPoint>::UnsignedCount(point_array);
  point_array_00 = ON_SimpleArray<ON_3dPoint>::Array(point_array);
  SetFromDoubleArray(__return_storage_ptr__,(ulong)uVar1,3,&point_array_00->x);
  return __return_storage_ptr__;
}

Assistant:

ON_3dPointListRef ON_3dPointListRef::FromPointArray(
  const class ON_SimpleArray<ON_3dPoint>& point_array
  )
{
  ON_3dPointListRef p;
  p.SetFromDoubleArray(point_array.UnsignedCount(),3,(const double*)point_array.Array());
  return p;
}